

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluFboRenderContext.cpp
# Opt level: O3

void __thiscall
glu::FboRenderContext::FboRenderContext
          (FboRenderContext *this,RenderContext *context,RenderConfig *config)

{
  (this->super_RenderContext)._vptr_RenderContext = (_func_int **)&PTR__FboRenderContext_0217ee60;
  this->m_context = context;
  this->m_framebuffer = 0;
  this->m_colorBuffer = 0;
  this->m_depthStencilBuffer = 0;
  tcu::RenderTarget::RenderTarget(&this->m_renderTarget);
  createFramebuffer(this,config);
  return;
}

Assistant:

FboRenderContext::FboRenderContext (RenderContext* context, const RenderConfig& config)
	: m_context				(context)
	, m_framebuffer			(0)
	, m_colorBuffer			(0)
	, m_depthStencilBuffer	(0)
	, m_renderTarget		()
{
	try
	{
		createFramebuffer(config);
	}
	catch (...)
	{
		destroyFramebuffer();
		throw;
	}
}